

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O2

ostream * google::protobuf::operator<<(ostream *o,uint128 *b)

{
  uint *puVar1;
  uint uVar2;
  uint128 dividend;
  ostream *poVar3;
  ostream *poVar4;
  char cVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  uint128 divisor;
  uint128 divisor_00;
  string rep;
  uint128 mid;
  uint128 high;
  uint128 low;
  ostringstream os;
  uint auStack_190 [88];
  
  uVar2 = *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18);
  if ((uVar2 & 0x4a) == 8) {
    uVar6 = 0xf;
    uVar7 = 0x1000000000000000;
  }
  else if ((uVar2 & 0x4a) == 0x40) {
    uVar6 = 0x15;
    uVar7 = 0x8000000000000000;
  }
  else {
    uVar6 = 0x13;
    uVar7 = 10000000000000000000;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  *(uint *)((long)auStack_190 + *(long *)(_os + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(_os + -0x18)) & 0xffffbdb5 | uVar2 & 0x424a;
  high.lo_ = b->lo_;
  high.hi_ = b->hi_;
  low.lo_ = 0;
  low.hi_ = 0;
  divisor.hi_ = 0;
  divisor.lo_ = uVar7;
  uint128::DivModImpl(*b,divisor,&high,&low);
  mid.lo_ = 0;
  mid.hi_ = 0;
  dividend.hi_ = high.hi_;
  dividend.lo_ = high.lo_;
  divisor_00.hi_ = 0;
  divisor_00.lo_ = uVar7;
  uint128::DivModImpl(dividend,divisor_00,&high,&mid);
  if (high.lo_ == 0) {
    if (mid.lo_ == 0) goto LAB_002cc8ae;
    std::ostream::_M_insert<unsigned_long>((ulong)&os);
    puVar1 = (uint *)((long)auStack_190 + *(long *)(_os + -0x18));
    *puVar1 = *puVar1 & 0xfffffdff;
    poVar4 = std::operator<<(&os,0x30);
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)&os);
    poVar4 = (ostream *)&os;
    puVar1 = (uint *)((long)auStack_190 + *(long *)(_os + -0x18));
    *puVar1 = *puVar1 & 0xfffffdff;
    poVar3 = std::operator<<(poVar4,0x30);
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = uVar6;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  }
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = uVar6;
LAB_002cc8ae:
  std::ostream::_M_insert<unsigned_long>((ulong)&os);
  std::__cxx11::stringbuf::str();
  uVar7 = *(ulong *)(o + *(long *)(*(long *)o + -0x18) + 0x10);
  *(undefined8 *)(o + *(long *)(*(long *)o + -0x18) + 0x10) = 0;
  lVar8 = uVar7 - rep._M_string_length;
  if (rep._M_string_length <= uVar7 && lVar8 != 0) {
    cVar5 = (char)lVar8;
    if ((uVar2 & 0xb0) == 0x20) {
      std::ios::fill();
      std::__cxx11::string::append((ulong)&rep,cVar5);
    }
    else {
      std::ios::fill();
      std::__cxx11::string::insert((ulong)&rep,0,cVar5);
    }
  }
  poVar4 = std::operator<<(o,(string *)&rep);
  std::__cxx11::string::~string((string *)&rep);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  return poVar4;
}

Assistant:

std::ostream& operator<<(std::ostream& o, const uint128& b) {
  std::ios_base::fmtflags flags = o.flags();

  // Select a divisor which is the largest power of the base < 2^64.
  uint128 div;
  std::streamsize div_base_log;
  switch (flags & std::ios::basefield) {
    case std::ios::hex:
      div = static_cast<uint64>(GOOGLE_ULONGLONG(0x1000000000000000));  // 16^15
      div_base_log = 15;
      break;
    case std::ios::oct:
      div = static_cast<uint64>(GOOGLE_ULONGLONG(01000000000000000000000));  // 8^21
      div_base_log = 21;
      break;
    default:  // std::ios::dec
      div = static_cast<uint64>(GOOGLE_ULONGLONG(10000000000000000000));  // 10^19
      div_base_log = 19;
      break;
  }

  // Now piece together the uint128 representation from three chunks of
  // the original value, each less than "div" and therefore representable
  // as a uint64.
  std::ostringstream os;
  std::ios_base::fmtflags copy_mask =
      std::ios::basefield | std::ios::showbase | std::ios::uppercase;
  os.setf(flags & copy_mask, copy_mask);
  uint128 high = b;
  uint128 low;
  uint128::DivModImpl(high, div, &high, &low);
  uint128 mid;
  uint128::DivModImpl(high, div, &high, &mid);
  if (high.lo_ != 0) {
    os << high.lo_;
    os << std::noshowbase << std::setfill('0') << std::setw(div_base_log);
    os << mid.lo_;
    os << std::setw(div_base_log);
  } else if (mid.lo_ != 0) {
    os << mid.lo_;
    os << std::noshowbase << std::setfill('0') << std::setw(div_base_log);
  }
  os << low.lo_;
  std::string rep = os.str();

  // Add the requisite padding.
  std::streamsize width = o.width(0);
  if (width > rep.size()) {
    if ((flags & std::ios::adjustfield) == std::ios::left) {
      rep.append(width - rep.size(), o.fill());
    } else {
      rep.insert(static_cast<std::string::size_type>(0),
                 width - rep.size(), o.fill());
    }
  }

  // Stream the final representation in a single "<<" call.
  return o << rep;
}